

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
SimulationDecPOMDPDiscrete::Step
          (SimulationDecPOMDPDiscrete *this,Index jaI,uint t,Index *sI,Index *joI,double *r,
          double *sumR,double specialR)

{
  bool bVar1;
  uint uVar2;
  DecPOMDPDiscreteInterface *pDVar3;
  ostream *poVar4;
  long *plVar5;
  JointAction *pJVar6;
  JointObservation *pJVar7;
  void *this_00;
  uint *in_RCX;
  undefined4 in_EDX;
  uint in_ESI;
  Simulation *in_RDI;
  uint *in_R8;
  double *in_R9;
  double in_XMM0_Qa;
  double __x;
  double dVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  double *in_stack_00000008;
  Index sI_suc;
  undefined8 in_stack_fffffffffffffe48;
  Index jaI_00;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffe50;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [48];
  string local_58 [36];
  uint local_34;
  double local_30;
  double *local_28;
  uint *local_20;
  uint *local_18;
  undefined4 local_10;
  uint local_c;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  jaI_00 = (Index)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  local_30 = in_XMM0_Qa;
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  pDVar3 = PlanningUnitDecPOMDPDiscrete::GetDPOMDPD
                     ((PlanningUnitDecPOMDPDiscrete *)in_RDI[1]._vptr_Simulation);
  local_34 = (**(code **)(*(long *)(&pDVar3->field_0x0 + *(long *)(*(long *)pDVar3 + -0xb8)) + 0x148
                         ))(&pDVar3->field_0x0 + *(long *)(*(long *)pDVar3 + -0xb8),*local_18,
                            local_c);
  pDVar3 = PlanningUnitDecPOMDPDiscrete::GetDPOMDPD
                     ((PlanningUnitDecPOMDPDiscrete *)in_RDI[1]._vptr_Simulation);
  uVar2 = (**(code **)(*(long *)(&pDVar3->field_0x0 + *(long *)(*(long *)pDVar3 + -0xb8)) + 0x150))
                    (&pDVar3->field_0x0 + *(long *)(*(long *)pDVar3 + -0xb8),local_c,local_34);
  *local_20 = uVar2;
  pDVar3 = PlanningUnitDecPOMDPDiscrete::GetDPOMDPD
                     ((PlanningUnitDecPOMDPDiscrete *)in_RDI[1]._vptr_Simulation);
  auVar12 = (**(code **)(*(long *)pDVar3 + 0xc0))(pDVar3,*local_18,local_c);
  auVar11._0_8_ = auVar12._8_8_;
  auVar11._8_56_ = extraout_var_00;
  auVar10 = auVar11._0_16_;
  *local_28 = auVar12._0_8_ + local_30;
  dVar8 = *local_28;
  __x = PlanningUnitDecPOMDPDiscrete::GetDiscount((PlanningUnitDecPOMDPDiscrete *)0x8f56d1);
  auVar10 = vcvtusi2sd_avx512f(auVar10,local_10);
  auVar9._0_8_ = pow(__x,auVar10._0_8_);
  auVar9._8_56_ = extraout_var;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar8;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *in_stack_00000008;
  auVar10 = vfmadd213sd_fma(auVar9._0_16_,auVar10,auVar12);
  *in_stack_00000008 = auVar10._0_8_;
  bVar1 = Simulation::GetVerbose(in_RDI);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Simulation::RunSimulation (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*local_18);
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_c);
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_34);
    poVar4 = std::operator<<(poVar4,") (");
    pDVar3 = PlanningUnitDecPOMDPDiscrete::GetDPOMDPD
                       ((PlanningUnitDecPOMDPDiscrete *)in_RDI[1]._vptr_Simulation);
    plVar5 = (long *)(**(code **)(*(long *)(&pDVar3->field_0x0 + *(long *)(*(long *)pDVar3 + -0xb8))
                                 + 0x38))
                               (&pDVar3->field_0x0 + *(long *)(*(long *)pDVar3 + -0xb8),*local_18);
    (**(code **)(*plVar5 + 0x18))();
    poVar4 = std::operator<<(poVar4,local_58);
    poVar4 = std::operator<<(poVar4,",");
    pJVar6 = PlanningUnitMADPDiscrete::GetJointAction(in_stack_fffffffffffffe50,jaI_00);
    (*pJVar6->_vptr_JointAction[4])(local_88);
    poVar4 = std::operator<<(poVar4,local_88);
    poVar4 = std::operator<<(poVar4,",");
    pDVar3 = PlanningUnitDecPOMDPDiscrete::GetDPOMDPD
                       ((PlanningUnitDecPOMDPDiscrete *)in_RDI[1]._vptr_Simulation);
    plVar5 = (long *)(**(code **)(*(long *)(&pDVar3->field_0x0 + *(long *)(*(long *)pDVar3 + -0xb8))
                                 + 0x38))
                               (&pDVar3->field_0x0 + *(long *)(*(long *)pDVar3 + -0xb8),local_34);
    (**(code **)(*plVar5 + 0x18))(local_a8);
    poVar4 = std::operator<<(poVar4,local_a8);
    poVar4 = std::operator<<(poVar4,") (p ");
    pDVar3 = PlanningUnitDecPOMDPDiscrete::GetDPOMDPD
                       ((PlanningUnitDecPOMDPDiscrete *)in_RDI[1]._vptr_Simulation);
    dVar8 = (double)(**(code **)(*(long *)(&pDVar3->field_0x0 + *(long *)(*(long *)pDVar3 + -0xb8))
                                + 0x108))
                              (&pDVar3->field_0x0 + *(long *)(*(long *)pDVar3 + -0xb8),*local_18,
                               local_c,local_34);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar8);
    poVar4 = std::operator<<(poVar4,") jo ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*local_20);
    poVar4 = std::operator<<(poVar4," ");
    pJVar7 = PlanningUnitMADPDiscrete::GetJointObservation(in_stack_fffffffffffffe50,jaI_00);
    (*pJVar7->_vptr_JointObservation[4])(local_c8);
    poVar4 = std::operator<<(poVar4,local_c8);
    poVar4 = std::operator<<(poVar4," (p ");
    pDVar3 = PlanningUnitDecPOMDPDiscrete::GetDPOMDPD
                       ((PlanningUnitDecPOMDPDiscrete *)in_RDI[1]._vptr_Simulation);
    dVar8 = (double)(**(code **)(*(long *)(&pDVar3->field_0x0 + *(long *)(*(long *)pDVar3 + -0xb8))
                                + 0x118))
                              (&pDVar3->field_0x0 + *(long *)(*(long *)pDVar3 + -0xb8),local_c,
                               local_34,*local_20);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar8);
    poVar4 = std::operator<<(poVar4,") r ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*local_28);
    poVar4 = std::operator<<(poVar4," sumR ");
    this_00 = (void *)std::ostream::operator<<(poVar4,*in_stack_00000008);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_58);
  }
  *local_18 = local_34;
  return;
}

Assistant:

void SimulationDecPOMDPDiscrete::Step(Index jaI, unsigned int t, Index &sI,
                                      Index &joI, double &r,
                                      double &sumR, double specialR) const
{
    Index sI_suc=_m_pu->GetDPOMDPD()->SampleSuccessorState(sI,jaI);

    joI=_m_pu->GetDPOMDPD()->SampleJointObservation(jaI,sI_suc);
    r = _m_pu->GetDPOMDPD()->GetReward(sI,jaI) + specialR;

    // calc. the discounted reward
    sumR+=r*pow(_m_pu->GetDiscount(),static_cast<double>(t));
    
    if(GetVerbose())
        cout << "Simulation::RunSimulation ("
             << sI << "," << jaI << "," << sI_suc << ") ("
             << (_m_pu->GetDPOMDPD()->GetState(sI)->SoftPrintBrief())
             << ","
             << (_m_pu->GetJointAction(jaI))->SoftPrintBrief()
             << ","
             << (_m_pu->GetDPOMDPD()->GetState(sI_suc)->SoftPrintBrief())
             << ") (p " 
             << _m_pu->GetDPOMDPD()->GetTransitionProbability(sI,jaI,sI_suc) 
             << ") jo " << joI << " "
             << (_m_pu->GetJointObservation(joI))->SoftPrintBrief()
             << " (p " 
             << _m_pu->GetDPOMDPD()->GetObservationProbability(jaI,sI_suc,joI)
             << ") r " << r << " sumR " << sumR << endl;

    sI = sI_suc;
}